

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

ssh_hashalg * rsa2_hash_alg_for_flags(uint flags,char **protocol_id_out)

{
  char *local_28;
  char *protocol_id;
  ssh_hashalg *halg;
  char **protocol_id_out_local;
  uint flags_local;
  
  if ((flags & 2) == 0) {
    if ((flags & 4) == 0) {
      protocol_id = "\x10X\x19";
      local_28 = "ssh-rsa";
    }
    else {
      protocol_id = (char *)&ssh_sha512;
      local_28 = "rsa-sha2-512";
    }
  }
  else {
    protocol_id = "p-\x19";
    local_28 = "rsa-sha2-256";
  }
  if (protocol_id_out != (char **)0x0) {
    *protocol_id_out = local_28;
  }
  return (ssh_hashalg *)protocol_id;
}

Assistant:

static inline const ssh_hashalg *rsa2_hash_alg_for_flags(
    unsigned flags, const char **protocol_id_out)
{
    const ssh_hashalg *halg;
    const char *protocol_id;

    if (flags & SSH_AGENT_RSA_SHA2_256) {
        halg = &ssh_sha256;
        protocol_id = "rsa-sha2-256";
    } else if (flags & SSH_AGENT_RSA_SHA2_512) {
        halg = &ssh_sha512;
        protocol_id = "rsa-sha2-512";
    } else {
        halg = &ssh_sha1;
        protocol_id = "ssh-rsa";
    }

    if (protocol_id_out)
        *protocol_id_out = protocol_id;

    return halg;
}